

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

bool testing::internal::
     TypeParameterizedTestSuite<phmap::priv::ModifiersTest,_testing::internal::Templates<phmap::priv::gtest_suite_ModifiersTest_::Insert,_phmap::priv::gtest_suite_ModifiersTest_::InsertHint,_phmap::priv::gtest_suite_ModifiersTest_::InsertRange,_phmap::priv::gtest_suite_ModifiersTest_::Emplace,_phmap::priv::gtest_suite_ModifiersTest_::EmplaceHint,_phmap::priv::gtest_suite_ModifiersTest_::Erase,_phmap::priv::gtest_suite_ModifiersTest_::EraseRange,_phmap::priv::gtest_suite_ModifiersTest_::EraseKey,_phmap::priv::gtest_suite_ModifiersTest_::Swap>,_testing::internal::Types<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_4UL,_phmap::NullMutex>_>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  FILE *__stream;
  bool bVar1;
  CodeLocation *pCVar2;
  char *pcVar3;
  int line;
  char *str;
  string test_name;
  string local_e0;
  CodeLocation local_c0;
  CodeLocation local_98;
  string local_70;
  string local_50;
  
  pcVar3 = case_name;
  RegisterTypeParameterizedTestSuiteInstantiation(case_name);
  line = (int)pcVar3;
  GetPrefixUntilComma_abi_cxx11_(&local_50,(internal *)test_names,str);
  StripTrailingSpaces(&local_e0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = TypedTestSuitePState::TestExists(state,&local_e0);
  __stream = _stderr;
  if (bVar1) {
    pCVar2 = TypedTestSuitePState::GetCodeLocation(state,&local_e0);
    CodeLocation::CodeLocation(&local_c0,pCVar2);
    TypeParameterizedTest<phmap::priv::ModifiersTest,_testing::internal::TemplateSel<phmap::priv::gtest_suite_ModifiersTest_::Insert>,_testing::internal::Types<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_4UL,_phmap::NullMutex>_>_>
    ::Register(prefix,&local_c0,case_name,test_names,0,type_names);
    std::__cxx11::string::~string((string *)&local_c0);
    CodeLocation::CodeLocation(&local_98,code_location);
    pcVar3 = SkipComma(test_names);
    bVar1 = TypeParameterizedTestSuite<phmap::priv::ModifiersTest,_testing::internal::Templates<phmap::priv::gtest_suite_ModifiersTest_::InsertHint,_phmap::priv::gtest_suite_ModifiersTest_::InsertRange,_phmap::priv::gtest_suite_ModifiersTest_::Emplace,_phmap::priv::gtest_suite_ModifiersTest_::EmplaceHint,_phmap::priv::gtest_suite_ModifiersTest_::Erase,_phmap::priv::gtest_suite_ModifiersTest_::EraseRange,_phmap::priv::gtest_suite_ModifiersTest_::EraseKey,_phmap::priv::gtest_suite_ModifiersTest_::Swap>,_testing::internal::Types<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_4UL,_phmap::NullMutex>_>_>
            ::Register(prefix,&local_98,state,case_name,pcVar3,type_names);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_e0);
    return bVar1;
  }
  FormatFileLocation_abi_cxx11_
            (&local_70,(internal *)(code_location->file)._M_dataplus._M_p,
             (char *)(ulong)(uint)code_location->line,line);
  fprintf(__stream,"Failed to get code location for test %s.%s at %s.",case_name,
          local_e0._M_dataplus._M_p,local_70._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_70);
  fflush(_stderr);
  posix::Abort();
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix,
                                                       std::move(code_location),
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }